

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mailManager.cpp
# Opt level: O0

bool __thiscall mailManager::login_smtp(mailManager *this,char *email,char *password)

{
  mailSocket *pmVar1;
  char *pcVar2;
  ostream *poVar3;
  bool bVar4;
  string local_80 [48];
  string local_50 [32];
  int local_30;
  int local_2c;
  int i;
  int retCode;
  char *password_local;
  char *email_local;
  mailManager *this_local;
  
  local_2c = 0;
  local_30 = 0;
  this->email = email;
  this->password = password;
  _i = password;
  password_local = email;
  email_local = (char *)this;
  mailSocket::sendData(this->socket,"HELO ");
  mailSocket::sendData(this->socket,password_local);
  mailSocket::sendData(this->socket,"\r\n");
  mailSocket::recvData(this->socket,this->recvData,0x400);
  mailSocket::sendData(this->socket,"auth login\r\n");
  mailSocket::recvData(this->socket,this->recvData,0x400);
  pcVar2 = password_local;
  pmVar1 = this->socket;
  strlen(password_local);
  base64_encode_abi_cxx11_((char *)local_50,(int)pcVar2);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  mailSocket::sendData(pmVar1,pcVar2);
  std::__cxx11::string::~string(local_50);
  mailSocket::sendData(this->socket,"\r\n");
  mailSocket::recvData(this->socket,this->recvData,0x400);
  pcVar2 = _i;
  pmVar1 = this->socket;
  strlen(_i);
  base64_encode_abi_cxx11_((char *)local_80,(int)pcVar2);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  mailSocket::sendData(pmVar1,pcVar2);
  std::__cxx11::string::~string(local_80);
  mailSocket::sendData(this->socket,"\r\n");
  mailSocket::recvData(this->socket,this->recvData,0x400);
  for (local_30 = 0; local_30 < 3; local_30 = local_30 + 1) {
    local_2c = local_2c * 10 + this->recvData[local_30] + -0x30;
  }
  bVar4 = local_2c == 0xeb;
  if (!bVar4) {
    poVar3 = std::operator<<((ostream *)&std::cout,"error : ");
    poVar3 = std::operator<<(poVar3,this->recvData);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  return bVar4;
}

Assistant:

bool mailManager::login_smtp(const char *email, const char *password) {
    int retCode = 0, i = 0;

    this->email = email;
    this->password = password;

    socket->sendData("HELO ");
    //HELO后面有个空格
    socket->sendData(email);
    socket->sendData("\r\n");
    socket->recvData(recvData, BUF_SIZE);

    socket->sendData("auth login\r\n");
    socket->recvData(recvData, BUF_SIZE);

    socket->sendData(base64_encode((char *) email, (int) strlen(email)).c_str());
    socket->sendData("\r\n");
    socket->recvData(recvData, BUF_SIZE);

    socket->sendData(base64_encode((char *) password, (int) strlen(password)).c_str());
    socket->sendData("\r\n");
    socket->recvData(recvData, BUF_SIZE);

    for (i = 0; i < 3; ++i) {
        retCode = retCode * 10 + (recvData[i] - '0');
    }


    if (retCode != 235) {
        std::cout << "error : " << recvData << std::endl;
        return false;
    }

    return true;
}